

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_casts.cpp
# Opt level: O2

BoundCastInfo *
duckdb::DefaultCasts::ListCastSwitch
          (BoundCastInfo *__return_storage_ptr__,BindCastInput *input,LogicalType *source,
          LogicalType *target)

{
  LogicalTypeId LVar1;
  LogicalType *source_00;
  LogicalType *target_00;
  pointer *__ptr;
  undefined1 local_88 [32];
  vector<duckdb::BoundCastInfo,_true> child_cast_info;
  BoundCastInfo local_48;
  BoundCastData *local_30;
  
  LVar1 = target->id_;
  if (LVar1 == VARCHAR) {
    LogicalType::LogicalType((LogicalType *)&local_48,VARCHAR);
    LogicalType::LIST((LogicalType *)&child_cast_info,(LogicalType *)&local_48);
    ListBoundCastData::BindListToListCast
              ((ListBoundCastData *)local_88,input,source,(LogicalType *)&child_cast_info);
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,ListToVarcharCast,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)local_88,ListBoundCastData::InitListLocalState);
    if ((_func_int **)local_88._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_88._0_8_ + 8))();
    }
    local_88._0_8_ = (_func_int **)0x0;
    LogicalType::~LogicalType((LogicalType *)&child_cast_info);
    LogicalType::~LogicalType((LogicalType *)&local_48);
  }
  else {
    if (LVar1 == ARRAY) {
      child_cast_info.super_vector<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>.
      super__Vector_base<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      child_cast_info.super_vector<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>.
      super__Vector_base<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      child_cast_info.super_vector<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>.
      super__Vector_base<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      source_00 = ListType::GetChildType(source);
      target_00 = ArrayType::GetChildType(target);
      BindCastInput::GetCastFunction(&local_48,input,source_00,target_00);
      make_uniq<duckdb::ListBoundCastData,duckdb::BoundCastInfo>((duckdb *)&local_30,&local_48);
      local_88._8_8_ = local_30;
      if ((_Head_base<0UL,_duckdb::BoundCastData_*,_false>)
          local_48.cast_data.
          super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
          super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
          .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl !=
          (_Head_base<0UL,_duckdb::BoundCastData_*,_false>)0x0) {
        (*(*(_func_int ***)
            local_48.cast_data.
            super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>.
            _M_t.
            super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
            .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl)[1])();
      }
      ::std::vector<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>::~vector
                (&child_cast_info.
                  super_vector<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>);
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,ListToArrayCast,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)(local_88 + 8),ListBoundCastData::InitListLocalState);
      local_88._24_8_ = local_88._8_8_;
    }
    else if (LVar1 == LIST) {
      ListBoundCastData::BindListToListCast
                ((ListBoundCastData *)(local_88 + 0x18),input,source,target);
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,ListCast::ListToListCast,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)(local_88 + 0x18),ListBoundCastData::InitListLocalState);
    }
    else {
      local_88._16_8_ = (BoundCastData *)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,TryVectorNullCast,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)(local_88 + 0x10),(init_cast_local_state_t)0x0);
      local_88._24_8_ = local_88._16_8_;
    }
    if ((_Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>)
        local_88._24_8_ != (BoundCastData *)0x0) {
      (**(code **)(*(long *)local_88._24_8_ + 8))();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BoundCastInfo DefaultCasts::ListCastSwitch(BindCastInput &input, const LogicalType &source, const LogicalType &target) {
	switch (target.id()) {
	case LogicalTypeId::LIST:
		return BoundCastInfo(ListCast::ListToListCast, ListBoundCastData::BindListToListCast(input, source, target),
		                     ListBoundCastData::InitListLocalState);
	case LogicalTypeId::VARCHAR:
		return BoundCastInfo(
		    ListToVarcharCast,
		    ListBoundCastData::BindListToListCast(input, source, LogicalType::LIST(LogicalType::VARCHAR)),
		    ListBoundCastData::InitListLocalState);
	case LogicalTypeId::ARRAY:
		return BoundCastInfo(ListToArrayCast, BindListToArrayCast(input, source, target),
		                     ListBoundCastData::InitListLocalState);
	default:
		return DefaultCasts::TryVectorNullCast;
	}
}